

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void write_bytes<double>(void *ptr,size_t n_els,ostream *out)

{
  if (n_els != 0) {
    std::ostream::write((char *)out,(long)ptr);
    if (((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 1) != 0) {
      throw_errno();
    }
  }
  return;
}

Assistant:

void write_bytes(const void *ptr, const size_t n_els, std::ostream &out)
{
    if (n_els == 0) return;
    out.write((char*)ptr, n_els * sizeof(dtype));
    if (unlikely(out.bad())) throw_errno();
}